

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O1

void synthetic_reset(stagewise_poly *poly,example *ec)

{
  label_t lVar1;
  wclass *pwVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  uchar local_9;
  
  (poly->synth_ec).l.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
  lVar1 = (ec->l).multi;
  pwVar2 = (ec->l).cs.costs._end;
  sVar3 = (ec->l).cs.costs.erase_count;
  (poly->synth_ec).l.cs.costs.end_array = (ec->l).cs.costs.end_array;
  (poly->synth_ec).l.cs.costs.erase_count = sVar3;
  (poly->synth_ec).l.multi = lVar1;
  (poly->synth_ec).l.cs.costs._end = pwVar2;
  (poly->synth_ec).weight = ec->weight;
  pcVar4 = (ec->tag)._begin;
  pcVar5 = (ec->tag)._end;
  sVar3 = (ec->tag).erase_count;
  (poly->synth_ec).tag.end_array = (ec->tag).end_array;
  (poly->synth_ec).tag.erase_count = sVar3;
  (poly->synth_ec).tag._begin = pcVar4;
  (poly->synth_ec).tag._end = pcVar5;
  (poly->synth_ec).example_counter = ec->example_counter;
  (poly->synth_ec).super_example_predict.ft_offset = (ec->super_example_predict).ft_offset;
  (poly->synth_ec).test_only = ec->test_only;
  (poly->synth_ec).end_pass = ec->end_pass;
  (poly->synth_ec).sorted = ec->sorted;
  (poly->synth_ec).in_use = ec->in_use;
  features::clear((poly->synth_ec).super_example_predict.feature_space + 0x86);
  (poly->synth_ec).num_features = 0;
  (poly->synth_ec).total_sum_feat_sq = 0.0;
  if ((poly->synth_ec).super_example_predict.indices._end ==
      (poly->synth_ec).super_example_predict.indices._begin) {
    local_9 = 0x86;
    v_array<unsigned_char>::push_back((v_array<unsigned_char> *)&poly->synth_ec,&local_9);
  }
  return;
}

Assistant:

void synthetic_reset(stagewise_poly &poly, example &ec)
{
  poly.synth_ec.l = ec.l;
  poly.synth_ec.weight = ec.weight;
  poly.synth_ec.tag = ec.tag;
  poly.synth_ec.example_counter = ec.example_counter;

  /**
   * Some comments on ft_offset.
   *
   * The plan is to do the feature mapping dfs with weight indices ignoring
   * the ft_offset.  This is because ft_offset is then added at the end,
   * guaranteeing local/strided access on synth_ec.  This might not matter
   * too much in this implementation (where, e.g., --oaa runs one after the
   * other, not interleaved), but who knows.
   *
   * (The other choice is to basically ignore adjusting for ft_offset when
   * doing the traversal, which means synth_ec.ft_offset is 0 here...)
   *
   * Anyway, so here is how ft_offset matters:
   *   - synthetic_create_rec must "normalize it out" of the fed weight value
   *   - parent and min_depths set/get are adjusted for it.
   *   - cycle set/get are not adjusted for it, since it doesn't matter for them.
   *   - operations on the whole weight vector (sorting, save_load, all_reduce)
   *     ignore ft_offset, just treat the thing as a flat vector.
   **/
  poly.synth_ec.ft_offset = ec.ft_offset;

  poly.synth_ec.test_only = ec.test_only;
  poly.synth_ec.end_pass = ec.end_pass;
  poly.synth_ec.sorted = ec.sorted;
  poly.synth_ec.in_use = ec.in_use;

  poly.synth_ec.feature_space[tree_atomics].clear();
  poly.synth_ec.num_features = 0;
  poly.synth_ec.total_sum_feat_sq = 0;

  if (poly.synth_ec.indices.size() == 0)
    poly.synth_ec.indices.push_back(tree_atomics);
}